

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::UninterpretedOption::UninterpretedOption
          (UninterpretedOption *this,UninterpretedOption *from)

{
  InternalMetadataWithArena *this_00;
  Rep *pRVar1;
  void *pvVar2;
  int64 iVar3;
  void **our_elems;
  int iVar4;
  Arena *pAVar5;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__UninterpretedOption_00683340;
  this_00 = &this->_internal_metadata_;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  *(undefined8 *)&this->_cached_size_ = 0;
  *(undefined8 *)((long)&(this->name_).super_RepeatedPtrFieldBase.arena_ + 4) = 0;
  (this->name_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->name_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->name_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  iVar4 = (from->name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    pRVar1 = (from->name_).super_RepeatedPtrFieldBase.rep_;
    our_elems = internal::RepeatedPtrFieldBase::InternalExtend
                          (&(this->name_).super_RepeatedPtrFieldBase,iVar4);
    internal::RepeatedPtrFieldBase::
    MergeFromInnerLoop<google::protobuf::RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::TypeHandler>
              (&(this->name_).super_RepeatedPtrFieldBase,our_elems,pRVar1->elements,iVar4,
               ((this->name_).super_RepeatedPtrFieldBase.rep_)->allocated_size -
               (this->name_).super_RepeatedPtrFieldBase.current_size_);
    iVar4 = iVar4 + (this->name_).super_RepeatedPtrFieldBase.current_size_;
    (this->name_).super_RepeatedPtrFieldBase.current_size_ = iVar4;
    pRVar1 = (this->name_).super_RepeatedPtrFieldBase.rep_;
    if (pRVar1->allocated_size < iVar4) {
      pRVar1->allocated_size = iVar4;
    }
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (this_00,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  (this->identifier_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 1) != 0) {
    pAVar5 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->identifier_value_,pAVar5,(from->identifier_value_).ptr_);
  }
  (this->string_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 2) != 0) {
    pAVar5 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance(&this->string_value_,pAVar5,(from->string_value_).ptr_)
    ;
  }
  (this->aggregate_value_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if (((from->_has_bits_).has_bits_[0] & 4) != 0) {
    pAVar5 = (Arena *)(this_00->
                      super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                      ).ptr_;
    if (((ulong)pAVar5 & 1) != 0) {
      pAVar5 = *(Arena **)(((ulong)pAVar5 & 0xfffffffffffffffe) + 0x18);
    }
    internal::ArenaStringPtr::CreateInstance
              (&this->aggregate_value_,pAVar5,(from->aggregate_value_).ptr_);
  }
  this->double_value_ = from->double_value_;
  iVar3 = from->negative_int_value_;
  this->positive_int_value_ = from->positive_int_value_;
  this->negative_int_value_ = iVar3;
  return;
}

Assistant:

UninterpretedOption::UninterpretedOption(const UninterpretedOption& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      name_(from.name_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  identifier_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_identifier_value()) {
    identifier_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_identifier_value(),
      GetArenaNoVirtual());
  }
  string_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_string_value()) {
    string_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_string_value(),
      GetArenaNoVirtual());
  }
  aggregate_value_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (from._internal_has_aggregate_value()) {
    aggregate_value_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_aggregate_value(),
      GetArenaNoVirtual());
  }
  ::memcpy(&positive_int_value_, &from.positive_int_value_,
    static_cast<size_t>(reinterpret_cast<char*>(&double_value_) -
    reinterpret_cast<char*>(&positive_int_value_)) + sizeof(double_value_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.UninterpretedOption)
}